

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O0

int bandit::run(int argc,char **argv,bool allow_further)

{
  int iVar1;
  undefined1 local_c8 [8];
  choice_options choices;
  bool allow_further_local;
  char **argv_local;
  int argc_local;
  
  choices.reporters.default_it._M_node._7_1_ = allow_further;
  detail::choice_options::choice_options((choice_options *)local_c8);
  use_defaults((choice_options *)local_c8);
  iVar1 = run(argc,argv,(choice_options *)local_c8,
              (bool)(choices.reporters.default_it._M_node._7_1_ & 1));
  detail::choice_options::~choice_options((choice_options *)local_c8);
  return iVar1;
}

Assistant:

inline int run(int argc, char* argv[], bool allow_further = true) {
    detail::choice_options choices;

    use_defaults(choices);

    return run(argc, argv, choices, allow_further);
  }